

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_subx_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  int opsize_00;
  int iVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 ret;
  TCGv_i32 dest_00;
  int opsize;
  TCGv_i32 addr_dest;
  TCGv_i32 dest;
  TCGv_i32 addr_src;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  opsize_00 = insn_opsize((uint)insn);
  pTVar2 = get_areg(s,insn & 7);
  iVar1 = opsize_bytes(opsize_00);
  tcg_gen_subi_i32_m68k(tcg_ctx_00,pTVar2,pTVar2,iVar1);
  pTVar2 = gen_load(s,opsize_00,pTVar2,1,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1)
                   );
  ret = get_areg(s,(int)(uint)insn >> 9 & 7);
  iVar1 = opsize_bytes(opsize_00);
  tcg_gen_subi_i32_m68k(tcg_ctx_00,ret,ret,iVar1);
  dest_00 = gen_load(s,opsize_00,ret,1,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  gen_subx(s,pTVar2,dest_00,opsize_00);
  gen_store(s,opsize_00,ret,QREG_CC_N,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  tcg_temp_free_i32(tcg_ctx_00,dest_00);
  tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  return;
}

Assistant:

DISAS_INSN(subx_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv addr_src;
    TCGv dest;
    TCGv addr_dest;
    int opsize;

    opsize = insn_opsize(insn);

    addr_src = AREG(insn, 0);
    tcg_gen_subi_i32(tcg_ctx, addr_src, addr_src, opsize_bytes(opsize));
    src = gen_load(s, opsize, addr_src, 1, IS_USER(s));

    addr_dest = AREG(insn, 9);
    tcg_gen_subi_i32(tcg_ctx, addr_dest, addr_dest, opsize_bytes(opsize));
    dest = gen_load(s, opsize, addr_dest, 1, IS_USER(s));

    gen_subx(s, src, dest, opsize);

    gen_store(s, opsize, addr_dest, QREG_CC_N, IS_USER(s));

    tcg_temp_free(tcg_ctx, dest);
    tcg_temp_free(tcg_ctx, src);
}